

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

yang_type *
lys_yang_type_dup(lys_module *module,lys_node *parent,yang_type *old,lys_type *type,int in_grp,
                 int shallow,unres_schema *unres)

{
  int iVar1;
  yang_type *__ptr;
  char *pcVar2;
  yang_type *new;
  int shallow_local;
  int in_grp_local;
  lys_type *type_local;
  yang_type *old_local;
  lys_node *parent_local;
  lys_module *module_local;
  
  __ptr = (yang_type *)calloc(1,0x18);
  if (__ptr == (yang_type *)0x0) {
    ly_log(module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_yang_type_dup");
  }
  else {
    __ptr->flags = old->flags;
    __ptr->base = old->base;
    pcVar2 = lydict_insert(module->ctx,old->name,0);
    __ptr->name = pcVar2;
    __ptr->type = type;
    if (__ptr->name == (char *)0x0) {
      ly_log(module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_yang_type_dup");
    }
    else {
      iVar1 = type_dup(module,parent,type,old->type,__ptr->base,in_grp,shallow,unres);
      if (iVar1 == 0) {
        return __ptr;
      }
      __ptr->type->base = __ptr->base;
      lys_type_free(module->ctx,__ptr->type,(_func_void_lys_node_ptr_void_ptr *)0x0);
      memset(&__ptr->type->info,0,0x20);
    }
    free(__ptr);
  }
  return (yang_type *)0x0;
}

Assistant:

struct yang_type *
lys_yang_type_dup(struct lys_module *module, struct lys_node *parent, struct yang_type *old, struct lys_type *type,
                  int in_grp, int shallow, struct unres_schema *unres)
{
    struct yang_type *new;

    new = calloc(1, sizeof *new);
    LY_CHECK_ERR_RETURN(!new, LOGMEM(module->ctx), NULL);
    new->flags = old->flags;
    new->base = old->base;
    new->name = lydict_insert(module->ctx, old->name, 0);
    new->type = type;
    if (!new->name) {
        LOGMEM(module->ctx);
        goto error;
    }
    if (type_dup(module, parent, type, old->type, new->base, in_grp, shallow, unres)) {
        new->type->base = new->base;
        lys_type_free(module->ctx, new->type, NULL);
        memset(&new->type->info, 0, sizeof new->type->info);
        goto error;
    }
    return new;

error:
    free(new);
    return NULL;
}